

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_ATMOS.cpp
# Opt level: O0

void __thiscall ASDCP::ATMOS::MXFReader::~MXFReader(MXFReader *this)

{
  byte bVar1;
  h__Reader *phVar2;
  MXFReader *this_local;
  
  this->_vptr_MXFReader = (_func_int **)&PTR__MXFReader_0033d330;
  phVar2 = ASDCP::mem_ptr::operator_cast_to_h__Reader_((mem_ptr *)&this->m_Reader);
  if (phVar2 != (h__Reader *)0x0) {
    phVar2 = mem_ptr<ASDCP::ATMOS::MXFReader::h__Reader>::operator->(&this->m_Reader);
    bVar1 = (**(code **)(*(long *)(phVar2->super_h__ASDCPReader).
                                  super_TrackFileReader<ASDCP::MXF::OP1aHeader,_ASDCP::MXF::OPAtomIndexFooter>
                                  .m_File + 0x40))();
    if ((bVar1 & 1) != 0) {
      phVar2 = mem_ptr<ASDCP::ATMOS::MXFReader::h__Reader>::operator->(&this->m_Reader);
      MXF::TrackFileReader<ASDCP::MXF::OP1aHeader,_ASDCP::MXF::OPAtomIndexFooter>::Close
                ((TrackFileReader<ASDCP::MXF::OP1aHeader,_ASDCP::MXF::OPAtomIndexFooter> *)phVar2);
    }
  }
  mem_ptr<ASDCP::ATMOS::MXFReader::h__Reader>::~mem_ptr(&this->m_Reader);
  return;
}

Assistant:

ASDCP::ATMOS::MXFReader::~MXFReader()
{
  if ( m_Reader && m_Reader->m_File->IsOpen() )
    m_Reader->Close();
}